

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall
Rml::Element::StartTransition
          (Element *this,Transition *transition,Property *start_value,Property *target_value)

{
  Tween *pTVar1;
  bool bVar2;
  pointer pEVar3;
  reference this_00;
  float fVar4;
  byte local_141;
  const_iterator local_138;
  undefined8 local_130;
  CallbackFnc local_128;
  byte local_119;
  undefined1 local_118 [7];
  bool result;
  float local_d4;
  iterator iStack_d0;
  float f;
  ElementAnimation *local_c8;
  ElementAnimation local_b0;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_70;
  double local_68;
  double start_time;
  iterator iStack_58;
  float duration;
  Transition *local_50;
  ElementAnimation *local_48;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_40;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_38;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  it;
  Property *target_value_local;
  Property *start_value_local;
  Transition *transition_local;
  Element *this_local;
  
  it._M_current = (ElementAnimation *)target_value;
  local_40._M_current =
       (ElementAnimation *)
       ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::begin
                 (&this->animations);
  local_48 = (ElementAnimation *)
             ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                       (&this->animations);
  local_50 = transition;
  local_38 = ::std::
             find_if<__gnu_cxx::__normal_iterator<Rml::ElementAnimation*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>,Rml::Element::StartTransition(Rml::Transition_const&,Rml::Property_const&,Rml::Property_const&)::__0>
                       (local_40,(__normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                                  )local_48,(anon_class_8_1_36b3b713_for__M_pred)transition);
  iStack_58 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                        (&this->animations);
  bVar2 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffa8);
  local_141 = 0;
  if (bVar2) {
    pEVar3 = __gnu_cxx::
             __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
             ::operator->(&local_38);
    bVar2 = ElementAnimation::IsTransition(pEVar3);
    local_141 = bVar2 ^ 0xff;
  }
  if ((local_141 & 1) == 0) {
    start_time._4_4_ = transition->duration;
    local_68 = Clock::GetElapsedTime();
    local_68 = local_68 + (double)transition->delay;
    local_70._M_current =
         (ElementAnimation *)
         ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                   (&this->animations);
    bVar2 = __gnu_cxx::operator==(&local_38,&local_70);
    if (bVar2) {
      ElementAnimation::ElementAnimation
                (&local_b0,transition->id,Transition,start_value,this,local_68,0.0,1,false);
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::push_back
                (&this->animations,&local_b0);
      ElementAnimation::~ElementAnimation(&local_b0);
      iStack_d0 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                            (&this->animations);
      local_c8 = (ElementAnimation *)
                 __gnu_cxx::
                 __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                 ::operator-(&stack0xffffffffffffff30,1);
      local_38 = (__normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                  )local_c8;
    }
    else {
      pEVar3 = __gnu_cxx::
               __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
               ::operator->(&local_38);
      fVar4 = ElementAnimation::GetInterpolationFactor(pEVar3);
      local_d4 = -(1.0 - fVar4) * transition->reverse_adjustment_factor + 1.0;
      start_time._4_4_ = start_time._4_4_ * local_d4;
      ElementAnimation::ElementAnimation
                ((ElementAnimation *)local_118,transition->id,Transition,start_value,this,local_68,
                 0.0,1,false);
      this_00 = __gnu_cxx::
                __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                ::operator*(&local_38);
      ElementAnimation::operator=(this_00,(ElementAnimation *)local_118);
      ElementAnimation::~ElementAnimation((ElementAnimation *)local_118);
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
             ::operator->(&local_38);
    pTVar1 = &transition->tween;
    local_130._0_4_ = pTVar1->type_in;
    local_130._4_4_ = pTVar1->type_out;
    local_128 = (transition->tween).callback;
    local_119 = ElementAnimation::AddKey
                          (pEVar3,start_time._4_4_,(Property *)it._M_current,this,*pTVar1,true);
    if ((bool)local_119) {
      SetProperty(this,transition->id,start_value);
    }
    else {
      __gnu_cxx::
      __normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
      ::__normal_iterator<Rml::ElementAnimation*>
                ((__normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
                  *)&local_138,&local_38);
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
                (&this->animations,local_138);
    }
    this_local._7_1_ = (bool)(local_119 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Element::StartTransition(const Transition& transition, const Property& start_value, const Property& target_value)
{
	auto it = std::find_if(animations.begin(), animations.end(), [&](const ElementAnimation& el) { return el.GetPropertyId() == transition.id; });

	if (it != animations.end() && !it->IsTransition())
		return false;

	float duration = transition.duration;
	double start_time = Clock::GetElapsedTime() + (double)transition.delay;

	if (it == animations.end())
	{
		// Add transition as new animation
		animations.push_back(ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false});
		it = (animations.end() - 1);
	}
	else
	{
		// Compress the duration based on the progress of the current animation
		float f = it->GetInterpolationFactor();
		f = 1.0f - (1.0f - f) * transition.reverse_adjustment_factor;
		duration = duration * f;
		// Replace old transition
		*it = ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false};
	}

	bool result = it->AddKey(duration, target_value, *this, transition.tween, true);

	if (result)
		SetProperty(transition.id, start_value);
	else
		animations.erase(it);

	return result;
}